

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCase::init
          (TextureGatherCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  ostringstream *this_01;
  ostringstream *this_02;
  ChannelOrder CVar2;
  RenderContext *context;
  code *pcVar3;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  data;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  data_00;
  bool bVar4;
  int iVar5;
  ContextType ctxType;
  deUint32 dVar6;
  undefined4 extraout_var;
  TypedObjectWrapper<(glu::ObjectType)2> *this_03;
  TypedObjectWrapper<(glu::ObjectType)3> *this_04;
  char *pcVar8;
  ulong uVar9;
  MessageBuilder *this_05;
  ostream *poVar10;
  NotSupportedError *this_06;
  TestError *pTVar11;
  string *psVar12;
  undefined4 uVar13;
  void *__buf;
  void *__buf_00;
  undefined4 uVar14;
  long lVar15;
  TypedObjectWrapper<(glu::ObjectType)2> *in_stack_fffffffffffff938;
  TestLog *pTVar16;
  IVec2 offsetRange;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  MessageBuilder local_630;
  MessageBuilder local_4b0;
  MessageBuilder local_330;
  MessageBuilder local_1b0;
  long lVar7;
  
  pTVar16 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar5 = (*context->_vptr_RenderContext[3])(context);
  lVar7 = CONCAT44(extraout_var,iVar5);
  if ((ulong)this->m_textureType < 3) {
    uVar14 = *(undefined4 *)(&DAT_00851380 + (ulong)this->m_textureType * 4);
  }
  else {
    uVar14 = 0xffffffff;
  }
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar4 = glu::contextSupports(ctxType,(ApiType)0x23);
  if ((!bVar4) && ((this->m_gatherType & ~GATHERTYPE_OFFSET) == GATHERTYPE_OFFSET_DYNAMIC)) {
    bVar4 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_gpu_shader5");
    if (!bVar4) {
      this_06 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_630,"GL_EXT_gpu_shader5 required",(allocator<char> *)&local_4b0);
      tcu::NotSupportedError::NotSupportedError(this_06,(string *)&local_630);
      __cxa_throw(this_06,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  if (this->m_offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
    getOffsetRange((TextureGatherCase *)&offsetRange);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_330,"ImplementationMinTextureGatherOffset",
               (allocator<char> *)&stack0xfffffffffffff93f);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,
               "Implementation\'s value for GL_MIN_PROGRAM_TEXTURE_GATHER_OFFSET",
               (allocator<char> *)&stack0xfffffffffffff93e);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_650,SSBOArrayLengthTests::init::arraysSized + 1,
               (allocator<char> *)&stack0xfffffffffffff93d);
    psVar12 = &local_650;
    tcu::LogNumber<long>::LogNumber
              ((LogNumber<long> *)&local_630,(string *)&local_330,(string *)&local_1b0,psVar12,
               QP_KEY_TAG_NONE,(long)offsetRange.m_data[0]);
    tcu::LogNumber<long>::write((LogNumber<long> *)&local_630,(int)pTVar16,__buf,(size_t)psVar12);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_670,"ImplementationMaxTextureGatherOffset",
               (allocator<char> *)&stack0xfffffffffffff93c);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_690,
               "Implementation\'s value for GL_MAX_PROGRAM_TEXTURE_GATHER_OFFSET",
               (allocator<char> *)&stack0xfffffffffffff93b);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6b0,SSBOArrayLengthTests::init::arraysSized + 1,
               (allocator<char> *)&stack0xfffffffffffff93a);
    psVar12 = &local_6b0;
    tcu::LogNumber<long>::LogNumber
              ((LogNumber<long> *)&local_4b0,&local_670,&local_690,psVar12,QP_KEY_TAG_NONE,
               (long)offsetRange.m_data[1]);
    tcu::LogNumber<long>::write((LogNumber<long> *)&local_4b0,(int)pTVar16,__buf_00,(size_t)psVar12)
    ;
    tcu::LogNumber<long>::~LogNumber((LogNumber<long> *)&local_4b0);
    std::__cxx11::string::~string((string *)&local_6b0);
    std::__cxx11::string::~string((string *)&local_690);
    std::__cxx11::string::~string((string *)&local_670);
    tcu::LogNumber<long>::~LogNumber((LogNumber<long> *)&local_630);
    std::__cxx11::string::~string((string *)&local_650);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_330);
    if (-8 < offsetRange.m_data[0]) {
      pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
      local_330.m_log = (TestLog *)CONCAT44(local_330.m_log._4_4_,0xfffffff8);
      de::toString<int>((string *)&local_4b0,(int *)&local_330);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_630
                     ,"GL_MIN_PROGRAM_TEXTURE_GATHER_OFFSET must be at most ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4b0
                    );
      tcu::TestError::TestError
                (pTVar11,(char *)local_630.m_log,"offsetRange[0] <= SPEC_MAX_MIN_OFFSET",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureGatherTests.cpp"
                 ,0x4f4);
      __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if (offsetRange.m_data[1] < 7) {
      pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
      local_330.m_log = (TestLog *)CONCAT44(local_330.m_log._4_4_,7);
      de::toString<int>((string *)&local_4b0,(int *)&local_330);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_630
                     ,"GL_MAX_PROGRAM_TEXTURE_GATHER_OFFSET must be at least ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4b0
                    );
      tcu::TestError::TestError
                (pTVar11,(char *)local_630.m_log,"offsetRange[1] >= SPEC_MIN_MAX_OFFSET",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureGatherTests.cpp"
                 ,0x4f5);
      __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  this_03 = (TypedObjectWrapper<(glu::ObjectType)2> *)operator_new(0x18);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper(this_03,context);
  local_630.m_log = (TestLog *)0x0;
  data._8_8_ = pTVar16;
  data.ptr = in_stack_fffffffffffff938;
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  ::assignData(&(this->m_colorBuffer).
                super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
               ,data);
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  ::~UniqueBase((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                 *)&local_630);
  (**(code **)(lVar7 + 0xa0))
            (0x8d41,(((this->m_colorBuffer).
                      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                      .m_data.ptr)->super_ObjectWrapper).m_object);
  pcVar3 = *(code **)(lVar7 + 0x1238);
  dVar6 = glu::getInternalFormat(this->m_colorBufferFormat);
  (*pcVar3)(0x8d41,dVar6,0x40);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"Create and setup renderbuffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureGatherTests.cpp"
                  ,0x4fd);
  this_04 = (TypedObjectWrapper<(glu::ObjectType)3> *)operator_new(0x18);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper(this_04,context);
  local_630.m_log = (TestLog *)0x0;
  data_00._8_8_ = pTVar16;
  data_00.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)in_stack_fffffffffffff938;
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::assignData(&(this->m_fbo).
                super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
               ,data_00);
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::~UniqueBase((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                 *)&local_630);
  (**(code **)(lVar7 + 0x78))
            (0x8d40,(((this->m_fbo).
                      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                      .m_data.ptr)->super_ObjectWrapper).m_object);
  (**(code **)(lVar7 + 0x688))
            (0x8d40,0x8ce0,0x8d41,
             (((this->m_colorBuffer).
               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
               .m_data.ptr)->super_ObjectWrapper).m_object);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"Create and setup framebuffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureGatherTests.cpp"
                  ,0x502);
  poVar1 = &local_630.m_str;
  local_630.m_log = pTVar16;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Using a framebuffer object with renderbuffer with format ");
  dVar6 = glu::getInternalFormat(this->m_colorBufferFormat);
  pcVar8 = glu::getTextureFormatName(dVar6);
  std::operator<<((ostream *)poVar1,pcVar8);
  std::operator<<((ostream *)poVar1," and size ");
  tcu::operator<<((ostream *)poVar1,
                  (Vector<int,_2> *)&(anonymous_namespace)::TextureGatherCase::RENDER_SIZE);
  tcu::MessageBuilder::operator<<(&local_630,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  this->m_currentIteration = 0;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
  pcVar3 = *(code **)(lVar7 + 0x1360);
  dVar6 = glu::getGLWrapMode(this->m_wrapS);
  (*pcVar3)(uVar14,0x2802,dVar6);
  pcVar3 = *(code **)(lVar7 + 0x1360);
  dVar6 = glu::getGLWrapMode(this->m_wrapT);
  (*pcVar3)(uVar14,0x2803,dVar6);
  pcVar3 = *(code **)(lVar7 + 0x1360);
  dVar6 = glu::getGLFilterMode(this->m_minFilter);
  (*pcVar3)(uVar14,0x2801,dVar6);
  pcVar3 = *(code **)(lVar7 + 0x1360);
  dVar6 = glu::getGLFilterMode(this->m_magFilter);
  (*pcVar3)(uVar14,0x2800,dVar6);
  if (this->m_baseLevel != 0) {
    (**(code **)(lVar7 + 0x1360))(uVar14,0x813c);
  }
  CVar2 = (this->m_textureFormat).order;
  if ((CVar2 == DS) || (CVar2 == D)) {
    (**(code **)(lVar7 + 0x1360))(uVar14,0x884c,0x884e);
    pcVar3 = *(code **)(lVar7 + 0x1360);
    dVar6 = glu::getGLCompareFunc(this->m_shadowCompareMode);
    (*pcVar3)(uVar14,0x884d,dVar6);
  }
  if ((this->m_textureSwizzle).m_isSome == true) {
    for (lVar15 = 0; lVar15 != 0x10; lVar15 = lVar15 + 4) {
      uVar9 = (ulong)*(uint *)((long)(this->m_textureSwizzle).m_swizzle.m_data + lVar15);
      uVar13 = 0xffffffff;
      if (uVar9 < 6) {
        uVar13 = *(undefined4 *)(&DAT_0085138c + uVar9 * 4);
      }
      (**(code **)(lVar7 + 0x1360))(uVar14,*(undefined4 *)((long)&DAT_00851030 + lVar15),uVar13);
    }
  }
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"Set texture parameters",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureGatherTests.cpp"
                  ,0x52f);
  poVar1 = &local_1b0.m_str;
  local_1b0.m_log = pTVar16;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Texture base level is ");
  this_05 = tcu::MessageBuilder::operator<<(&local_1b0,&this->m_baseLevel);
  local_330.m_log =
       tcu::MessageBuilder::operator<<(this_05,(EndMessageToken *)&tcu::TestLog::EndMessage);
  this_00 = &local_330.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"s and t wrap modes are ");
  dVar6 = glu::getGLWrapMode(this->m_wrapS);
  pcVar8 = glu::getTextureWrapModeName(dVar6);
  std::operator<<((ostream *)this_00,pcVar8);
  std::operator<<((ostream *)this_00," and ");
  dVar6 = glu::getGLWrapMode(this->m_wrapT);
  this_01 = &local_630.m_str;
  pcVar8 = glu::getTextureWrapModeName(dVar6);
  std::operator<<((ostream *)this_00,pcVar8);
  std::operator<<((ostream *)this_00,", respectively");
  local_4b0.m_log =
       tcu::MessageBuilder::operator<<(&local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
  this_02 = &local_4b0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_02);
  std::operator<<((ostream *)this_02,"Minification and magnification filter modes are ");
  dVar6 = glu::getGLFilterMode(this->m_minFilter);
  pcVar8 = glu::getTextureFilterName(dVar6);
  std::operator<<((ostream *)this_02,pcVar8);
  std::operator<<((ostream *)this_02," and ");
  dVar6 = glu::getGLFilterMode(this->m_magFilter);
  pcVar8 = glu::getTextureFilterName(dVar6);
  std::operator<<((ostream *)this_02,pcVar8);
  std::operator<<((ostream *)this_02,", respectively ");
  pcVar8 = "(note that they cause the texture to be incomplete)";
  if ((this->m_flags & 1) == 0) {
    pcVar8 = "(note that they should have no effect on gather result)";
  }
  std::operator<<((ostream *)this_02,pcVar8);
  local_630.m_log =
       tcu::MessageBuilder::operator<<(&local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
  std::operator<<((ostream *)this_01,"Using texture swizzle ");
  if ((this->m_textureSwizzle).m_isSome == true) {
    poVar10 = std::operator<<((ostream *)this_01,"(");
    poVar10 = anon_unknown_0::operator<<(poVar10,(this->m_textureSwizzle).m_swizzle.m_data[0]);
    poVar10 = std::operator<<(poVar10,", ");
    poVar10 = anon_unknown_0::operator<<(poVar10,(this->m_textureSwizzle).m_swizzle.m_data[1]);
    poVar10 = std::operator<<(poVar10,", ");
    poVar10 = anon_unknown_0::operator<<(poVar10,(this->m_textureSwizzle).m_swizzle.m_data[2]);
    poVar10 = std::operator<<(poVar10,", ");
    poVar10 = anon_unknown_0::operator<<(poVar10,(this->m_textureSwizzle).m_swizzle.m_data[3]);
    pcVar8 = ")";
  }
  else {
    pcVar8 = "[default swizzle state]";
    poVar10 = (ostream *)this_01;
  }
  std::operator<<(poVar10,pcVar8);
  tcu::MessageBuilder::operator<<(&local_630,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_02);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  iVar5 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  if (this->m_shadowCompareMode != COMPAREMODE_NONE) {
    poVar1 = &local_630.m_str;
    local_630.m_log = pTVar16;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Using texture compare func ");
    dVar6 = glu::getGLCompareFunc(this->m_shadowCompareMode);
    pcVar8 = glu::getCompareFuncName(dVar6);
    std::operator<<((ostream *)poVar1,pcVar8);
    tcu::MessageBuilder::operator<<(&local_630,(EndMessageToken *)&tcu::TestLog::EndMessage);
    iVar5 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  return iVar5;
}

Assistant:

void TextureGatherCase::init (void)
{
	TestLog&					log				= m_testCtx.getLog();
	const glu::RenderContext&	renderCtx		= m_context.getRenderContext();
	const glw::Functions&		gl				= renderCtx.getFunctions();
	const deUint32				texTypeGL		= getGLTextureType(m_textureType);
	const bool					supportsES32	= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	// Check prerequisites.
	if (requireGpuShader5(m_gatherType) && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_gpu_shader5"))
		throw tcu::NotSupportedError("GL_EXT_gpu_shader5 required");

	// Log and check implementation offset limits, if appropriate.
	if (m_offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM)
	{
		const IVec2 offsetRange = getOffsetRange();
		log << TestLog::Integer("ImplementationMinTextureGatherOffset", "Implementation's value for GL_MIN_PROGRAM_TEXTURE_GATHER_OFFSET", "", QP_KEY_TAG_NONE, offsetRange[0])
			<< TestLog::Integer("ImplementationMaxTextureGatherOffset", "Implementation's value for GL_MAX_PROGRAM_TEXTURE_GATHER_OFFSET", "", QP_KEY_TAG_NONE, offsetRange[1]);
		TCU_CHECK_MSG(offsetRange[0] <= SPEC_MAX_MIN_OFFSET, ("GL_MIN_PROGRAM_TEXTURE_GATHER_OFFSET must be at most " + de::toString((int)SPEC_MAX_MIN_OFFSET)).c_str());
		TCU_CHECK_MSG(offsetRange[1] >= SPEC_MIN_MAX_OFFSET, ("GL_MAX_PROGRAM_TEXTURE_GATHER_OFFSET must be at least " + de::toString((int)SPEC_MIN_MAX_OFFSET)).c_str());
	}

	// Create rbo and fbo.

	m_colorBuffer = MovePtr<glu::Renderbuffer>(new glu::Renderbuffer(renderCtx));
	gl.bindRenderbuffer(GL_RENDERBUFFER, **m_colorBuffer);
	gl.renderbufferStorage(GL_RENDERBUFFER, glu::getInternalFormat(m_colorBufferFormat), RENDER_SIZE.x(), RENDER_SIZE.y());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Create and setup renderbuffer object");

	m_fbo = MovePtr<glu::Framebuffer>(new glu::Framebuffer(renderCtx));
	gl.bindFramebuffer(GL_FRAMEBUFFER, **m_fbo);
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, **m_colorBuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Create and setup framebuffer object");

	log << TestLog::Message << "Using a framebuffer object with renderbuffer with format "
							<< glu::getTextureFormatName(glu::getInternalFormat(m_colorBufferFormat))
							<< " and size " << RENDER_SIZE << TestLog::EndMessage;

	// Generate subclass-specific iterations.

	generateIterations();
	m_currentIteration = 0;

	// Initialize texture.

	createAndUploadTexture();
	gl.texParameteri(texTypeGL, GL_TEXTURE_WRAP_S,		glu::getGLWrapMode(m_wrapS));
	gl.texParameteri(texTypeGL, GL_TEXTURE_WRAP_T,		glu::getGLWrapMode(m_wrapT));
	gl.texParameteri(texTypeGL, GL_TEXTURE_MIN_FILTER,	glu::getGLFilterMode(m_minFilter));
	gl.texParameteri(texTypeGL, GL_TEXTURE_MAG_FILTER,	glu::getGLFilterMode(m_magFilter));

	if (m_baseLevel != 0)
		gl.texParameteri(texTypeGL, GL_TEXTURE_BASE_LEVEL, m_baseLevel);

	if (isDepthFormat(m_textureFormat))
	{
		gl.texParameteri(texTypeGL, GL_TEXTURE_COMPARE_MODE, GL_COMPARE_REF_TO_TEXTURE);
		gl.texParameteri(texTypeGL, GL_TEXTURE_COMPARE_FUNC, glu::getGLCompareFunc(m_shadowCompareMode));
	}

	if (m_textureSwizzle.isSome())
	{
		const deUint32 swizzleNamesGL[4] =
		{
			GL_TEXTURE_SWIZZLE_R,
			GL_TEXTURE_SWIZZLE_G,
			GL_TEXTURE_SWIZZLE_B,
			GL_TEXTURE_SWIZZLE_A
		};

		for (int i = 0; i < 4; i++)
		{
			const deUint32 curGLSwizzle = getGLTextureSwizzleComponent(m_textureSwizzle.getSwizzle()[i]);
			gl.texParameteri(texTypeGL, swizzleNamesGL[i], curGLSwizzle);
		}
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texture parameters");

	log << TestLog::Message << "Texture base level is " << m_baseLevel << TestLog::EndMessage
		<< TestLog::Message << "s and t wrap modes are "
							<< glu::getTextureWrapModeName(glu::getGLWrapMode(m_wrapS)) << " and "
							<< glu::getTextureWrapModeName(glu::getGLWrapMode(m_wrapT)) << ", respectively" << TestLog::EndMessage
		<< TestLog::Message << "Minification and magnification filter modes are "
							<< glu::getTextureFilterName(glu::getGLFilterMode(m_minFilter)) << " and "
							<< glu::getTextureFilterName(glu::getGLFilterMode(m_magFilter)) << ", respectively "
							<< ((m_flags & GATHERCASE_MIPMAP_INCOMPLETE) ?
								"(note that they cause the texture to be incomplete)" :
								"(note that they should have no effect on gather result)")
							<< TestLog::EndMessage
		<< TestLog::Message << "Using texture swizzle " << m_textureSwizzle << TestLog::EndMessage;

	if (m_shadowCompareMode != tcu::Sampler::COMPAREMODE_NONE)
		log << TestLog::Message << "Using texture compare func " << glu::getCompareFuncName(glu::getGLCompareFunc(m_shadowCompareMode)) << TestLog::EndMessage;
}